

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_event_process(nn_fsm_event *self)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  long in_RDI;
  void *srcptr;
  int type;
  int src;
  
  uVar1 = *(undefined4 *)(in_RDI + 8);
  uVar2 = *(undefined4 *)(in_RDI + 0x18);
  uVar3 = *(undefined8 *)(in_RDI + 0x10);
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x18) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  nn_fsm_feed((nn_fsm *)CONCAT44(uVar1,uVar2),(int)((ulong)uVar3 >> 0x20),(int)uVar3,
              (void *)0x2efb9c);
  return;
}

Assistant:

void nn_fsm_event_process (struct nn_fsm_event *self)
{
    int src;
    int type;
    void *srcptr;

    src = self->src;
    type = self->type;
    srcptr = self->srcptr;
    self->src = -1;
    self->type = -1;
    self->srcptr = NULL;

    nn_fsm_feed (self->fsm, src, type, srcptr);
}